

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O2

void __thiscall Args::Help::Help(Help *this,bool throwExceptionOnPrint)

{
  HelpPrinter *this_00;
  allocator local_41;
  string local_40 [32];
  
  Arg::Arg<char_const(&)[5]>(&this->super_Arg,'h',(char (*) [5])"help",true,false);
  (this->super_Arg).super_ArgIface._vptr_ArgIface = (_func_int **)&PTR__Help_00136b78;
  this_00 = (HelpPrinter *)operator_new(0x58);
  HelpPrinter::HelpPrinter(this_00);
  (this->m_printer)._M_t.
  super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>._M_t.
  super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>.
  super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl = (HelpPrinterIface *)this_00;
  this->m_throwExceptionOnPrint = throwExceptionOnPrint;
  std::__cxx11::string::string(local_40,"Print this help.",&local_41);
  std::__cxx11::string::_M_assign((string *)&(this->super_Arg).m_description);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::string(local_40,"Print this help.",&local_41);
  std::__cxx11::string::_M_assign((string *)&(this->super_Arg).m_longDescription);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

inline
Help::Help( bool throwExceptionOnPrint )
	:	Arg( SL( 'h' ), SL( "help" ), true, false )
	,	m_printer( new HelpPrinter )
	,	m_throwExceptionOnPrint( throwExceptionOnPrint )
{
	setDescription( SL( "Print this help." ) );
	setLongDescription( SL( "Print this help." ) );
}